

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O1

int Gem_GroupVarsInsert1(int Groups,int i,int fGroup)

{
  uint uVar1;
  
  if (i < -1) {
    __assert_fail("i+1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMaj.c"
                  ,0xa8,"int Gem_GroupVarsInsert1(int, int, int)");
  }
  if ((i != -1 && fGroup != 0) && (((uint)Groups >> (i & 0x1fU) & 1) == 0)) {
    __assert_fail("!fGroup || i == -1 || ((Groups >> i) & 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMaj.c"
                  ,0xa9,"int Gem_GroupVarsInsert1(int, int, int)");
  }
  if ((uint)fGroup < 2) {
    uVar1 = 0;
    if (i + 1 != 0) {
      uVar1 = 0xffffffff >> (~(byte)i & 0x1f);
    }
    return fGroup << ((byte)(i + 1) & 0x1f) | uVar1 & Groups | (~uVar1 & Groups) * 2;
  }
  __assert_fail("fGroup == 0 || fGroup == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMaj.c"
                ,0xaa,"int Gem_GroupVarsInsert1(int, int, int)");
}

Assistant:

int Gem_GroupVarsInsert1( int Groups, int i, int fGroup ) // insert one bit after i
{
    int Mask = i+1 ? Abc_InfoMask( i+1 ) : 0;
    assert( i+1 >= 0 );
    assert( !fGroup || i == -1 || ((Groups >> i) & 1) );
    assert( fGroup == 0 || fGroup == 1 );
    return (Groups & Mask) | ((Groups & ~Mask) << 1) | (fGroup << (i+1));
}